

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

void rtr_mgr_free(rtr_mgr_config *config)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  tommy_node_struct *ptVar2;
  void *ptr;
  long *ptr_00;
  tommy_list ptVar3;
  uint j;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR_MGR: %s()","rtr_mgr_free");
  __rwlock = &config->mutex;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  pfx_table_free(config->pfx_table);
  spki_table_free(config->spki_table);
  aspa_table_free(config->aspa_table,true);
  lrtr_free(config->spki_table);
  lrtr_free(config->pfx_table);
  ptVar3 = config->groups->list;
  while (ptVar3 != (tommy_list)0x0) {
    ptVar2 = ptVar3->next;
    ptr = ptVar3->data;
    for (uVar4 = 0; ptr_00 = *(long **)((long)ptr + 0x20), uVar4 < *(uint *)(ptr_00 + 1);
        uVar4 = uVar4 + 1) {
      tr_free((tr_socket *)**(undefined8 **)(*ptr_00 + uVar4 * 8));
    }
    lrtr_free(ptr_00);
    lrtr_free(ptr);
    ptVar3 = ptVar2;
  }
  lrtr_free(config->groups);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    lrtr_free(config);
    return;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT void rtr_mgr_free(struct rtr_mgr_config *config)
{
	MGR_DBG("%s()", __func__);
	pthread_rwlock_wrlock(&config->mutex);

	pfx_table_free(config->pfx_table);
	spki_table_free(config->spki_table);
	aspa_table_free(config->aspa_table, true);
	lrtr_free(config->spki_table);
	lrtr_free(config->pfx_table);

	/* Free linked list */
	tommy_node *head = tommy_list_head(&config->groups->list);

	while (head) {
		tommy_node *tmp = head;
		struct rtr_mgr_group_node *group_node = tmp->data;

		head = head->next;
		for (unsigned int j = 0; j < group_node->group->sockets_len; j++)
			tr_free(group_node->group->sockets[j]->tr_socket);

		lrtr_free(group_node->group);
		lrtr_free(group_node);
	}

	lrtr_free(config->groups);

	pthread_rwlock_unlock(&config->mutex);
	pthread_rwlock_destroy(&config->mutex);
	lrtr_free(config);
}